

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APA.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::APA::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,APA *this)

{
  ostream *poVar1;
  KINT32 Value;
  KStringStream ss;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"APA:",4);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n\tParam Index:  ",0x10);
  ENUMS::GetEnumAsStringAdditionalPassiveParameterIndex_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)((this->m_ApaUnion).m_ui16ParamIndex & 0x3fff),Value);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tStatus:       ( ",0x12);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," , ",3);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," )",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tValue:        ",0x10);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_i16Value);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString APA::GetAsString() const
{
    KStringStream ss;

    ss << "APA:"
       << "\n\tParam Index:  " << GetEnumAsStringAdditionalPassiveParameterIndex( m_ApaUnion.m_ui16APPI )
       << "\n\tStatus:       ( " << m_ApaUnion.m_ui16Status1 << " , " << m_ApaUnion.m_ui16Status2 << " )"
       << "\n\tValue:        " << m_i16Value
       << "\n";

    return ss.str();
}